

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.c
# Opt level: O1

_Bool remove_pending_cbs_operation(void *item,void *match_context,_Bool *continue_processing)

{
  if (item == match_context) {
    async_operation_destroy(*(ASYNC_OPERATION_HANDLE *)((long)match_context + 0x20));
  }
  *continue_processing = item != match_context;
  return item == match_context;
}

Assistant:

static bool remove_pending_cbs_operation(const void* item, const void* match_context, bool* continue_processing)
{
    bool result;

    if (item == match_context)
    {
        async_operation_destroy(((CBS_OPERATION*)match_context)->token_operation_async_context);

        result = true;
        *continue_processing = false;
    }
    else
    {
        result = false;
        *continue_processing = true;
    }

    return result;
}